

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O3

int libpd_process_short(int ticks,short *inBuffer,short *outBuffer)

{
  short sVar1;
  int iVar2;
  _instancestuff *p_Var3;
  t_sample *ptVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  t_sample *ptVar9;
  int iVar10;
  
  sys_lock();
  sys_pollgui();
  if (0 < ticks) {
    iVar10 = 0;
    p_Var3 = pd_maininstance.pd_stuff;
    do {
      ptVar4 = p_Var3->st_soundin;
      iVar2 = p_Var3->st_inchannels;
      iVar6 = 0;
      do {
        ptVar9 = ptVar4;
        iVar7 = iVar2;
        if (0 < iVar2) {
          do {
            sVar1 = *inBuffer;
            inBuffer = inBuffer + 1;
            *ptVar9 = (float)(int)sVar1 * 3.051851e-05;
            iVar7 = iVar7 + -1;
            ptVar9 = ptVar9 + 0x40;
          } while (iVar7 != 0);
        }
        iVar6 = iVar6 + 1;
        ptVar4 = ptVar4 + 1;
      } while (iVar6 != 0x40);
      iVar6 = 0;
      memset(p_Var3->st_soundout,0,(long)p_Var3->st_outchannels << 8);
      sched_tick();
      p_Var3 = pd_maininstance.pd_stuff;
      pfVar5 = (pd_maininstance.pd_stuff)->st_soundout;
      iVar2 = (pd_maininstance.pd_stuff)->st_outchannels;
      do {
        pfVar8 = pfVar5;
        iVar7 = iVar2;
        if (0 < iVar2) {
          do {
            *outBuffer = (short)(int)(*pfVar8 * 32767.0);
            outBuffer = outBuffer + 1;
            iVar7 = iVar7 + -1;
            pfVar8 = pfVar8 + 0x40;
          } while (iVar7 != 0);
        }
        iVar6 = iVar6 + 1;
        pfVar5 = pfVar5 + 1;
      } while (iVar6 != 0x40);
      iVar10 = iVar10 + 1;
    } while (iVar10 != ticks);
  }
  sys_unlock();
  return 0;
}

Assistant:

int libpd_process_short(const int ticks, const short *inBuffer, short *outBuffer) {
  PROCESS(* short_to_sample, * sample_to_short)
}